

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PipelineExecutor::FetchFromSource(PipelineExecutor *this,DataChunk *result)

{
  Pipeline *pPVar1;
  PhysicalOperator *pPVar2;
  ThreadContext *this_00;
  int iVar3;
  PhysicalOperator *op;
  type lstate;
  OperatorSourceInput source_input;
  type local_48;
  type local_40;
  InterruptState *local_38;
  
  pPVar1 = this->pipeline;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar1->source);
  StartOperator(this,(pPVar1->source).ptr);
  local_48 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->pipeline->source_state);
  local_40 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             ::operator*(&this->local_source_state);
  local_38 = &this->interrupt_state;
  pPVar1 = this->pipeline;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar1->source);
  pPVar2 = (pPVar1->source).ptr;
  op = (PhysicalOperator *)&this->context;
  iVar3 = (*pPVar2->_vptr_PhysicalOperator[0x11])(pPVar2,op,result,&local_48);
  if ((SourceResultType)iVar3 == FINISHED) {
    this_00 = (this->context).thread;
    op = (PhysicalOperator *)
         unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
         ::operator*(&this->pipeline->source_state);
    lstate = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
             ::operator*(&this->local_source_state);
    OperatorProfiler::FinishSource(&this_00->profiler,(GlobalSourceState *)op,lstate);
  }
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->pipeline->source);
  EndOperator(this,op,(optional_ptr<duckdb::DataChunk,_true>)result);
  return (SourceResultType)iVar3;
}

Assistant:

SourceResultType PipelineExecutor::FetchFromSource(DataChunk &result) {
	StartOperator(*pipeline.source);

	OperatorSourceInput source_input = {*pipeline.source_state, *local_source_state, interrupt_state};
	auto res = GetData(result, source_input);

	// Ensures sources only return empty results when Blocking or Finished
	D_ASSERT(res != SourceResultType::BLOCKED || result.size() == 0);
	if (res == SourceResultType::FINISHED) {
		// final call into the source - finish source execution
		context.thread.profiler.FinishSource(*pipeline.source_state, *local_source_state);
	}
	EndOperator(*pipeline.source, &result);

	return res;
}